

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawDoubleSky4PalCommand::Execute(DrawDoubleSky4PalCommand *this,DrawerThread *thread)

{
  undefined1 auVar1 [16];
  BYTE BVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  PalEntry PVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  int col_1;
  uint uVar14;
  uint uVar15;
  uint8_t uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  uint *puVar28;
  int iVar29;
  int iVar30;
  undefined1 auVar31 [16];
  uint local_e8 [8];
  uint local_c8 [12];
  undefined8 local_98;
  undefined8 uStack_90;
  uint8_t output [4];
  uint8_t *local_78 [4];
  uint8_t *local_58 [5];
  
  uVar3 = (this->super_PalSkyCommand)._count;
  iVar27 = (this->super_PalSkyCommand)._pitch;
  local_58[0] = (this->super_PalSkyCommand)._source[0];
  local_58[1] = (this->super_PalSkyCommand)._source[1];
  local_58[2] = (this->super_PalSkyCommand)._source[2];
  local_58[3] = (this->super_PalSkyCommand)._source[3];
  local_78[0] = (this->super_PalSkyCommand)._source2[0];
  local_78[1] = (this->super_PalSkyCommand)._source2[1];
  local_78[2] = (this->super_PalSkyCommand)._source2[2];
  local_78[3] = (this->super_PalSkyCommand)._source2[3];
  iVar4 = (this->super_PalSkyCommand)._sourceheight[0];
  iVar13 = (this->super_PalSkyCommand)._sourceheight[1];
  uVar5 = (this->super_PalSkyCommand)._texturefrac[0];
  uVar6 = (this->super_PalSkyCommand)._iscale[0];
  auVar1 = *(undefined1 (*) [16])(this->super_PalSkyCommand)._iscale;
  uVar7 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar19 = (uint)RGB32k.All
                 [(ulong)((uVar7 & 0xff) >> 3) +
                  (ulong)(uVar7 >> 6 & 0x3e0) + (ulong)(uVar7 >> 9 & 0x7c00)];
  uVar8 = (this->super_PalSkyCommand).solid_bottom;
  uVar14 = (uint)RGB32k.All
                 [(ulong)((uVar8 & 0xff) >> 3) +
                  (ulong)(uVar8 >> 6 & 0x3e0) + (ulong)(uVar8 >> 9 & 0x7c00)];
  iVar29 = (this->super_PalSkyCommand).super_DrawerCommand._dest_y;
  uVar26 = -((int)uVar5 / (int)uVar6);
  uVar15 = (int)(0x400000 - uVar5) / (int)uVar6;
  uVar23 = (int)(0x1c00000 - uVar5) / (int)uVar6;
  uVar18 = (int)(0x2000000 - uVar5) / (int)uVar6;
  if ((int)uVar3 <= (int)uVar26) {
    uVar26 = uVar3;
  }
  uVar26 = (int)uVar5 / (int)uVar6 >> 0x1f & uVar26;
  uVar22 = uVar3;
  if ((int)uVar15 < (int)uVar3) {
    uVar22 = uVar15;
  }
  uVar12 = uVar3;
  if ((int)uVar23 < (int)uVar3) {
    uVar12 = uVar23;
  }
  uVar17 = 0;
  if ((int)uVar23 < 1) {
    uVar12 = uVar17;
  }
  uVar23 = uVar3;
  if ((int)uVar18 < (int)uVar3) {
    uVar23 = uVar18;
  }
  uVar21 = thread->pass_start_y - iVar29;
  if ((int)uVar21 < 1) {
    uVar21 = uVar17;
  }
  iVar9 = thread->num_cores;
  uVar21 = (iVar9 - (int)((iVar29 + uVar21) - thread->core) % iVar9) % iVar9 + uVar21;
  if ((int)uVar15 < 1) {
    uVar22 = uVar17;
  }
  if ((int)uVar18 < 1) {
    uVar23 = uVar17;
  }
  puVar28 = (uint *)((this->super_PalSkyCommand)._dest + (int)(uVar21 * iVar27));
  auVar31._4_4_ = uVar21;
  auVar31._0_4_ = uVar21;
  auVar31._8_4_ = uVar21;
  auVar31._12_4_ = uVar21;
  iVar29 = auVar1._4_4_;
  iVar30 = auVar1._12_4_;
  auVar11._4_4_ = iVar29;
  auVar11._0_4_ = iVar29;
  auVar11._8_4_ = iVar30;
  auVar11._12_4_ = iVar30;
  local_c8[0] = uVar21 * auVar1._0_4_ + (this->super_PalSkyCommand)._texturefrac[0];
  local_c8[1] = iVar29 * uVar21 + (this->super_PalSkyCommand)._texturefrac[1];
  local_c8[2] = (int)((auVar31._8_8_ & 0xffffffff) * (ulong)auVar1._8_4_) +
                (this->super_PalSkyCommand)._texturefrac[2];
  local_c8[3] = (int)((auVar11._8_8_ & 0xffffffff) * (ulong)uVar21) +
                (this->super_PalSkyCommand)._texturefrac[3];
  local_98._0_4_ = auVar1._0_4_ * iVar9;
  local_98._4_4_ = iVar29 * iVar9;
  uStack_90 = auVar1._8_8_;
  lVar24 = (long)(iVar27 * iVar9);
  if ((int)uVar21 < (int)uVar26) {
    do {
      local_c8[0] = local_c8[0] + (int)local_98;
      local_c8[1] = local_c8[1] + iVar29 * iVar9;
      local_c8[2] = local_c8[2] + auVar1._8_4_;
      local_c8[3] = local_c8[3] + iVar30;
      *puVar28 = uVar19 << 8 | uVar19 << 0x10 | uVar19 << 0x18 | uVar19;
      puVar28 = (uint *)((long)puVar28 + lVar24);
      uVar21 = uVar21 + iVar9;
    } while ((int)uVar21 < (int)uVar26);
  }
  uVar26 = iVar13 - 1;
  if ((int)uVar21 < (int)uVar22) {
    do {
      lVar20 = 0;
      do {
        uVar19 = local_c8[lVar20];
        uVar15 = (uVar19 >> 8 & 0xffff) * iVar4 >> 0x10;
        bVar25 = local_58[lVar20][uVar15];
        if (bVar25 == 0) {
          if (uVar26 <= uVar15) {
            uVar15 = uVar26;
          }
          bVar25 = local_78[lVar20][uVar15];
        }
        PVar10.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar25].field_0.d;
        iVar27 = (int)uVar19 >> 0xe;
        if (0xff < iVar27) {
          iVar27 = 0x100;
        }
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar13 = 0x100 - iVar27;
        BVar2 = RGB32k.All
                [(ulong)(iVar13 * (uVar7 & 0xff) + ((uint)PVar10.field_0 & 0xff) * iVar27 >> 0xb) +
                 (ulong)(iVar13 * (uVar7 >> 8 & 0xff) + ((uint)PVar10.field_0 >> 8 & 0xff) * iVar27
                         >> 6 & 0xfe0) +
                 (ulong)(iVar13 * (uVar7 >> 0x10 & 0xff) +
                         ((uint)PVar10.field_0 >> 0x10 & 0xff) * iVar27 >> 1 & 0x1fc00)];
        local_c8[lVar20] = uVar19 + *(int *)((long)&local_98 + lVar20 * 4);
        *(BYTE *)((long)local_e8 + lVar20) = BVar2;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      *puVar28 = local_e8[0];
      puVar28 = (uint *)((long)puVar28 + lVar24);
      uVar21 = uVar21 + iVar9;
    } while ((int)uVar21 < (int)uVar22);
  }
  for (; (int)uVar21 < (int)uVar12; uVar21 = uVar21 + iVar9) {
    lVar20 = 0;
    do {
      uVar7 = local_c8[lVar20];
      uVar19 = (uVar7 >> 8 & 0xffff) * iVar4 >> 0x10;
      uVar16 = local_58[lVar20][uVar19];
      if (uVar16 == '\0') {
        if (uVar26 <= uVar19) {
          uVar19 = uVar26;
        }
        uVar16 = local_78[lVar20][uVar19];
      }
      iVar27 = *(int *)((long)&local_98 + lVar20 * 4);
      *(uint8_t *)((long)local_e8 + lVar20) = uVar16;
      local_c8[lVar20] = uVar7 + iVar27;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    *puVar28 = local_e8[0];
    puVar28 = (uint *)((long)puVar28 + lVar24);
  }
  if ((int)uVar21 < (int)uVar23) {
    do {
      lVar20 = 0;
      do {
        uVar7 = local_c8[lVar20];
        uVar19 = (uVar7 >> 8 & 0xffff) * iVar4 >> 0x10;
        bVar25 = local_58[lVar20][uVar19];
        if (bVar25 == 0) {
          if (uVar26 <= uVar19) {
            uVar19 = uVar26;
          }
          bVar25 = local_78[lVar20][uVar19];
        }
        PVar10.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar25].field_0.d;
        iVar27 = (int)(0x2000000 - uVar7) >> 0xe;
        if (0xff < iVar27) {
          iVar27 = 0x100;
        }
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar13 = 0x100 - iVar27;
        BVar2 = RGB32k.All
                [(ulong)(iVar13 * (uVar8 & 0xff) + ((uint)PVar10.field_0 & 0xff) * iVar27 >> 0xb) +
                 (ulong)(iVar13 * (uVar8 >> 8 & 0xff) + ((uint)PVar10.field_0 >> 8 & 0xff) * iVar27
                         >> 6 & 0xfe0) +
                 (ulong)(iVar13 * (uVar8 >> 0x10 & 0xff) +
                         ((uint)PVar10.field_0 >> 0x10 & 0xff) * iVar27 >> 1 & 0x1fc00)];
        local_c8[lVar20] = uVar7 + *(int *)((long)&local_98 + lVar20 * 4);
        *(BYTE *)((long)local_e8 + lVar20) = BVar2;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      *puVar28 = local_e8[0];
      puVar28 = (uint *)((long)puVar28 + lVar24);
      uVar21 = uVar21 + iVar9;
    } while ((int)uVar21 < (int)uVar23);
  }
  if ((int)uVar21 < (int)uVar3) {
    do {
      *puVar28 = uVar14 << 8 | uVar14 << 0x10 | uVar14 << 0x18 | uVar14;
      puVar28 = (uint *)((long)puVar28 + lVar24);
      uVar21 = uVar21 + iVar9;
    } while ((int)uVar21 < (int)uVar3);
  }
  return;
}

Assistant:

void DrawDoubleSky4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0[4] = { _source[0], _source[1], _source[2], _source[3] };
		const uint8_t *source1[4] = { _source2[0], _source2[1], _source2[2], _source2[3] };
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;
		const uint32_t *palette = (const uint32_t *)GPalette.BaseColors;
		int32_t frac[4] = { (int32_t)_texturefrac[0], (int32_t)_texturefrac[1], (int32_t)_texturefrac[2], (int32_t)_texturefrac[3] };
		int32_t fracstep[4] = { (int32_t)_iscale[0], (int32_t)_iscale[1], (int32_t)_iscale[2], (int32_t)_iscale[3] };
		uint8_t output[4];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);
		uint32_t solid_top_fill = RGB32k.RGB[(solid_top_r >> 3)][(solid_top_g >> 3)][(solid_top_b >> 3)];
		uint32_t solid_bottom_fill = RGB32k.RGB[(solid_bottom_r >> 3)][(solid_bottom_g >> 3)][(solid_bottom_b >> 3)];
		solid_top_fill = (solid_top_fill << 24) | (solid_top_fill << 16) | (solid_top_fill << 8) | solid_top_fill;
		solid_bottom_fill = (solid_bottom_fill << 24) | (solid_bottom_fill << 16) | (solid_bottom_fill << 8) | solid_bottom_fill;

		// Find bands for top solid color, top fade, center textured, bottom fade, bottom solid color:
		int fade_length = (1 << (24 - start_fade));
		int start_fadetop_y = (-frac[0]) / fracstep[0];
		int end_fadetop_y = (fade_length - frac[0]) / fracstep[0];
		int start_fadebottom_y = ((2 << 24) - fade_length - frac[0]) / fracstep[0];
		int end_fadebottom_y = ((2 << 24) - frac[0]) / fracstep[0];
		for (int col = 1; col < 4; col++)
		{
			start_fadetop_y = MIN(start_fadetop_y, (-frac[0]) / fracstep[0]);
			end_fadetop_y = MAX(end_fadetop_y, (fade_length - frac[0]) / fracstep[0]);
			start_fadebottom_y = MIN(start_fadebottom_y, ((2 << 24) - fade_length - frac[0]) / fracstep[0]);
			end_fadebottom_y = MAX(end_fadebottom_y, ((2 << 24) - frac[0]) / fracstep[0]);
		}
		start_fadetop_y = clamp(start_fadetop_y, 0, count);
		end_fadetop_y = clamp(end_fadetop_y, 0, count);
		start_fadebottom_y = clamp(start_fadebottom_y, 0, count);
		end_fadebottom_y = clamp(end_fadebottom_y, 0, count);

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int col = 0; col < 4; col++)
		{
			frac[col] += fracstep[col] * skipped;
			fracstep[col] *= thread->num_cores;
		}
		pitch *= thread->num_cores;
		int num_cores = thread->num_cores;
		int index = skipped;

		// Top solid color:
		while (index < start_fadetop_y)
		{
			*((uint32_t*)dest) = solid_top_fill;
			dest += pitch;
			for (int col = 0; col < 4; col++)
				frac[col] += fracstep[col];
			index += num_cores;
		}

		// Top fade:
		while (index < end_fadetop_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_top = MAX(MIN(frac[col] >> (16 - start_fade), 256), 0);
				int inv_alpha_top = 256 - alpha_top;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Textured center:
		while (index < start_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				frac[col] += fracstep[col];
			}

			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Fade bottom:
		while (index < end_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_bottom = MAX(MIN(((2 << 24) - frac[col]) >> (16 - start_fade), 256), 0);
				int inv_alpha_bottom = 256 - alpha_bottom;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Bottom solid color:
		while (index < count)
		{
			*((uint32_t*)dest) = solid_bottom_fill;
			dest += pitch;
			index += num_cores;
		}
	}